

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

void __thiscall
cppwinrt::method_signature::method_signature(method_signature *this,MethodDef *method)

{
  uint32_t uVar1;
  undefined4 uVar2;
  unsigned_short uVar3;
  ulong uVar4;
  uint uVar5;
  pair<winmd::reader::Param,_winmd::reader::Param> params;
  pair<winmd::reader::Param,_winmd::reader::Param> local_70;
  MethodDefSig *local_50;
  pointer local_48;
  Param local_40;
  
  uVar1 = (method->super_row_base<winmd::reader::MethodDef>).m_index;
  uVar2 = *(undefined4 *)&(method->super_row_base<winmd::reader::MethodDef>).field_0xc;
  (this->m_method).super_row_base<winmd::reader::MethodDef>.m_table =
       (method->super_row_base<winmd::reader::MethodDef>).m_table;
  (this->m_method).super_row_base<winmd::reader::MethodDef>.m_index = uVar1;
  *(undefined4 *)&(this->m_method).super_row_base<winmd::reader::MethodDef>.field_0xc = uVar2;
  local_50 = &this->m_signature;
  winmd::reader::MethodDef::Signature(local_50,method);
  (this->m_params).
  super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_return).super_row_base<winmd::reader::Param>.m_table = (table_base *)0x0;
  (this->m_params).
  super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_params).
  super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_return).super_row_base<winmd::reader::Param>.m_index = 0;
  winmd::reader::row_base<winmd::reader::MethodDef>::get_list<winmd::reader::Param>
            (&local_70,&method->super_row_base<winmd::reader::MethodDef>,5);
  if (*(bool *)((long)&(this->m_signature).m_ret_type.m_type.
                       super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
                       super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
                       super__Optional_payload_base<winmd::reader::TypeSig> + 0x88) == true) {
    if ((local_70.first.super_row_base<winmd::reader::Param>.m_table !=
         local_70.second.super_row_base<winmd::reader::Param>.m_table) ||
       (local_70.first.super_row_base<winmd::reader::Param>.m_index !=
        local_70.second.super_row_base<winmd::reader::Param>.m_index)) {
      uVar3 = winmd::reader::table_base::get_value<unsigned_short>
                        (local_70.first.super_row_base<winmd::reader::Param>.m_table,
                         local_70.first.super_row_base<winmd::reader::Param>.m_index,1);
      if (uVar3 == 0) {
        (this->m_return).super_row_base<winmd::reader::Param>.m_index =
             local_70.first.super_row_base<winmd::reader::Param>.m_index;
        (this->m_return).super_row_base<winmd::reader::Param>.m_table =
             local_70.first.super_row_base<winmd::reader::Param>.m_table;
        local_70.first.super_row_base<winmd::reader::Param>.m_index =
             local_70.first.super_row_base<winmd::reader::Param>.m_index + 1;
      }
    }
  }
  local_48 = (this->m_signature).m_params.
             super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_signature).m_params.
      super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>._M_impl.
      super__Vector_impl_data._M_finish != local_48) {
    uVar5 = 1;
    uVar4 = 0;
    do {
      local_40.super_row_base<winmd::reader::Param>.m_index =
           (local_70.first.super_row_base<winmd::reader::Param>.m_index + uVar5) - 1;
      local_40.super_row_base<winmd::reader::Param>.m_table =
           local_70.first.super_row_base<winmd::reader::Param>.m_table;
      local_48 = local_48 + uVar4;
      std::
      vector<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>,std::allocator<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>>>
      ::emplace_back<winmd::reader::Param,winmd::reader::ParamSig_const*>
                ((vector<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>,std::allocator<std::pair<winmd::reader::Param,winmd::reader::ParamSig_const*>>>
                  *)&this->m_params,&local_40,&local_48);
      uVar4 = (ulong)uVar5;
      local_48 = (this->m_signature).m_params.
                 super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
    } while (((long)(this->m_signature).m_params.
                    super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)local_48 >> 3) *
             -0x30c30c30c30c30c3 - uVar4 != 0);
  }
  return;
}

Assistant:

explicit method_signature(MethodDef const& method) :
            m_method(method),
            m_signature(method.Signature())
        {
            auto params = method.ParamList();

            if (m_signature.ReturnType() && params.first != params.second && params.first.Sequence() == 0)
            {
                m_return = params.first;
                ++params.first;
            }

            for (uint32_t i{}; i != size(m_signature.Params()); ++i)
            {
                m_params.emplace_back(params.first + i, &m_signature.Params().first[i]);
            }
        }